

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.h
# Opt level: O3

void __thiscall
OpenMPDeclareReductionDirective::addTypenameList
          (OpenMPDeclareReductionDirective *this,char *_typename_list)

{
  pointer *pppcVar1;
  iterator __position;
  char *local_8;
  
  __position._M_current =
       (this->typename_list).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->typename_list).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = _typename_list;
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
              ((vector<char_const*,std::allocator<char_const*>> *)&this->typename_list,__position,
               &local_8);
  }
  else {
    *__position._M_current = _typename_list;
    pppcVar1 = &(this->typename_list).
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return;
}

Assistant:

void setIdentifier (std::string _identifier) { identifier = _identifier;}